

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

void __thiscall
EOPlus::Parser_Token_Server_Base::Parser_Token_Server_Base(Parser_Token_Server_Base *this)

{
  undefined1 local_50 [64];
  
  this->_vptr_Parser_Token_Server_Base = (_func_int **)&PTR___cxa_pure_virtual_001bc710;
  std::stack<EOPlus::Token,std::deque<EOPlus::Token,std::allocator<EOPlus::Token>>>::
  stack<std::deque<EOPlus::Token,std::allocator<EOPlus::Token>>,void>(&this->token_buffer);
  this->line = 1;
  util::variant::variant((variant *)local_50);
  Token::Token(&this->reject_token,Invalid,(variant *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 0x10));
  this->reject_line = 1;
  return;
}

Assistant:

Parser_Token_Server_Base::Parser_Token_Server_Base()
		: line(1)
		, reject_line(1)
	{ }